

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

lua_Unsigned luaH_getn(Table *t)

{
  byte bVar1;
  uint uVar2;
  TValue *pTVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar2 = t->alimit;
  uVar5 = (ulong)uVar2;
  if (uVar5 != 0) {
    pTVar3 = t->array;
    uVar8 = uVar2 - 1;
    uVar7 = (ulong)uVar8;
    if ((pTVar3[uVar7].tt_ & 0xf) == 0) {
      if ((uVar2 != 1) && (uVar4 = uVar2 - 2, (pTVar3[uVar4].tt_ & 0xf) != 0)) {
        if ((char)t->flags < '\0') {
          if ((uVar8 & uVar4) == 0) {
            return uVar7;
          }
        }
        else if ((uVar8 & uVar4) == 0 || (uVar2 & uVar8) != 0) {
          return uVar7;
        }
        t->alimit = uVar8;
        t->flags = t->flags | 0x80;
        return uVar7;
      }
      uVar8 = binsearch(pTVar3,0,uVar2);
      bVar1 = t->flags;
      if ((((char)bVar1 < '\0') ||
          (uVar2 = uVar2 - (uVar2 >> 1 & 0x55555555),
          uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333),
          ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) &&
         (uVar2 = luaH_realasize(t), uVar2 >> 1 < uVar8)) {
        t->alimit = uVar8;
        t->flags = bVar1 | 0x80;
      }
      return (ulong)uVar8;
    }
  }
  if (((char)t->flags < '\0') &&
     (uVar8 = uVar2 - (uVar2 >> 1 & 0x55555555),
     uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333),
     1 < ((uVar8 >> 4) + uVar8 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    pTVar3 = t->array;
    if ((pTVar3[uVar5].tt_ & 0xf) == 0) {
      return uVar5;
    }
    uVar8 = luaH_realasize(t);
    if ((pTVar3[uVar8 - 1].tt_ & 0xf) == 0) {
      uVar2 = binsearch(pTVar3,uVar2,uVar8);
      t->alimit = uVar2;
      return (ulong)uVar2;
    }
    uVar5 = (ulong)uVar8;
  }
  iVar6 = (int)uVar5;
  if ((t->lastfree != (Node *)0x0) &&
     (pTVar3 = luaH_getint(t,(ulong)(iVar6 + 1)), (pTVar3->tt_ & 0xf) != 0)) {
    uVar7 = (ulong)(iVar6 + (uint)(iVar6 == 0));
    do {
      uVar5 = uVar7;
      if (uVar5 >> 0x3e != 0) {
        pTVar3 = luaH_getint(t,0x7fffffffffffffff);
        uVar7 = 0x7fffffffffffffff;
        if ((pTVar3->tt_ & 0xf) != 0) {
          return 0x7fffffffffffffff;
        }
        break;
      }
      uVar7 = uVar5 * 2;
      pTVar3 = luaH_getint(t,uVar7);
    } while ((pTVar3->tt_ & 0xf) != 0);
    while (uVar9 = uVar7, 1 < uVar9 - uVar5) {
      uVar7 = uVar5 + uVar9 >> 1;
      pTVar3 = luaH_getint(t,uVar7);
      if ((pTVar3->tt_ & 0xf) != 0) {
        uVar5 = uVar7;
        uVar7 = uVar9;
      }
    }
  }
  return uVar5;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned int limit = t->alimit;
  if (limit > 0 && isempty(&t->array[limit - 1])) {  /* (1)? */
    /* there must be a boundary before 'limit' */
    if (limit >= 2 && !isempty(&t->array[limit - 2])) {
      /* 'limit - 1' is a boundary; can it be a new limit? */
      if (ispow2realasize(t) && !ispow2(limit - 1)) {
        t->alimit = limit - 1;
        setnorealasize(t);  /* now 'alimit' is not the real size */
      }
      return limit - 1;
    }
    else {  /* must search for a boundary in [0, limit] */
      unsigned int boundary = binsearch(t->array, 0, limit);
      /* can this boundary represent the real size of the array? */
      if (ispow2realasize(t) && boundary > luaH_realasize(t) / 2) {
        t->alimit = boundary;  /* use it as the new limit */
        setnorealasize(t);
      }
      return boundary;
    }
  }
  /* 'limit' is zero or present in table */
  if (!limitequalsasize(t)) {  /* (2)? */
    /* 'limit' > 0 and array has more elements after 'limit' */
    if (isempty(&t->array[limit]))  /* 'limit + 1' is empty? */
      return limit;  /* this is the boundary */
    /* else, try last element in the array */
    limit = luaH_realasize(t);
    if (isempty(&t->array[limit - 1])) {  /* empty? */
      /* there must be a boundary in the array after old limit,
         and it must be a valid new limit */
      unsigned int boundary = binsearch(t->array, t->alimit, limit);
      t->alimit = boundary;
      return boundary;
    }
    /* else, new limit is present in the table; check the hash part */
  }
  /* (3) 'limit' is the last element and either is zero or present in table */
  lua_assert(limit == luaH_realasize(t) &&
             (limit == 0 || !isempty(&t->array[limit - 1])));
  if (isdummy(t) || isempty(luaH_getint(t, cast(lua_Integer, limit + 1))))
    return limit;  /* 'limit + 1' is absent */
  else  /* 'limit + 1' is also present */
    return hash_search(t, limit);
}